

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareRenderer.hpp
# Opt level: O1

Image4u * __thiscall
eos::render::SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::
render<float>(Image4u *__return_storage_ptr__,
             SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader> *this
             ,Mesh *mesh,Matrix4<float> *model_view_matrix,Matrix4<float> *projection_matrix,
             optional<eos::render::Texture> *texture)

{
  pointer paVar1;
  DenseStorage<float,_2,_2,_1,_0> *pDVar2;
  float fVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer pMVar9;
  pointer pMVar10;
  pointer pMVar11;
  pointer pMVar12;
  pointer pMVar13;
  pointer paVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  pointer pVVar25;
  Mesh *pMVar26;
  Vertex<float> *pVVar27;
  Image4u *pIVar28;
  pointer paVar29;
  ulong uVar30;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar31;
  long lVar32;
  optional<eos::render::Texture> *texture_00;
  undefined1 auVar33 [8];
  long lVar34;
  long lVar35;
  pointer paVar36;
  Matrix<float,_3,_1,_0,_3,_1> *vertex_position;
  pointer pMVar37;
  ulong uVar38;
  byte bVar39;
  float fVar40;
  double dVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined4 in_XMM11_Db;
  undefined4 in_XMM11_Dc;
  undefined4 in_XMM11_Dd;
  Rect<int> RVar46;
  uchar visibility_bits [3];
  vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
  vertices;
  vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
  triangles_to_raster;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  clipspace_vertices;
  byte local_23b [3];
  undefined1 local_238 [8];
  pointer pVStack_230;
  pointer local_228;
  Mesh *local_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  long local_208;
  void *local_1f8;
  iterator iStack_1f0;
  Matrix<float,_4,_1,_0,_4,_1> *local_1e8;
  Vector4<float> local_1d8;
  pointer local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  float local_1a0;
  DenseStorage<float,_2,_2,_1,_0> local_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178 [3];
  DenseStorage<float,_2,_2,_1,_0> local_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148 [3];
  DenseStorage<float,_2,_2,_1,_0> local_13c;
  undefined1 local_128 [16];
  optional<eos::render::Texture> *local_118;
  Vector2<float> local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Image4u *local_50;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_48;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_40;
  pointer local_38;
  
  local_128._8_8_ = local_128._0_8_;
  local_128._0_8_ = projection_matrix;
  pMVar37 = (mesh->vertices).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar9 = (mesh->vertices).
           super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar10 = (mesh->colors).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar11 = (mesh->colors).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)pMVar9 - (long)pMVar37 != (long)pMVar10 - (long)pMVar11 && pMVar10 != pMVar11) {
    __assert_fail("mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x68,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  pMVar12 = (mesh->texcoords).
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar13 = (mesh->texcoords).
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((((long)pMVar9 - (long)pMVar37 >> 2) * -0x5555555555555555 -
        ((long)pMVar13 - (long)pMVar12 >> 3) != 0) && (pMVar12 != pMVar13)) &&
     ((mesh->tti).super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (mesh->tti).super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("mesh.vertices.size() == mesh.texcoords.size() || ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) || mesh.texcoords.empty()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x70,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  paVar29 = (mesh->tti).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  paVar36 = (mesh->tti).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if ((paVar29 != paVar36) &&
     ((long)paVar36 - (long)paVar29 !=
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start)) {
    __assert_fail("mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x72,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  local_220 = mesh;
  if ((pMVar13 == pMVar12) &&
     ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
      super__Optional_payload<eos::render::Texture,_true,_false,_false>.
      super__Optional_payload_base<eos::render::Texture>._M_engaged != false)) {
    __assert_fail("!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x75,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  local_1f8 = (void *)0x0;
  iStack_1f0._M_current = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_1e8 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_118 = texture;
  local_50 = __return_storage_ptr__;
  if (pMVar37 != pMVar9) {
    do {
      local_218 = *(undefined1 (*) [8])
                   (pMVar37->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array;
      uStack_210._4_4_ = 1.0;
      uStack_210._0_4_ =
           (pMVar37->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
      VertexShader::operator()
                ((VertexShader *)local_1b8,(Vector4<float> *)&this->field_0x90,
                 (Matrix4<float> *)local_218,model_view_matrix);
      if (iStack_1f0._M_current == local_1e8) {
        std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,1,0,4,1>>
                  ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                    *)&local_1f8,iStack_1f0,(Matrix<float,_4,_1,_0,_4,_1> *)local_1b8);
      }
      else {
        *(undefined8 *)
         ((iStack_1f0._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
         m_storage.m_data.array = local_1b8._0_8_;
        *(undefined8 *)
         (((iStack_1f0._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array + 2) = local_1b8._8_8_;
        iStack_1f0._M_current = iStack_1f0._M_current + 1;
      }
      pMVar37 = pMVar37 + 1;
    } while (pMVar37 != pMVar9);
  }
  local_218 = (undefined1  [8])0x0;
  uStack_210 = (Vertex<float> *)0x0;
  local_208 = 0;
  paVar29 = (local_220->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  texture_00 = local_118;
  if ((local_220->tvi).
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar29) {
    paVar36 = (local_220->tti).
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_38 = (local_220->tti).
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    lVar32 = 0;
    local_40 = &local_220->tti;
    local_48 = &local_220->tvi;
    uVar38 = 0;
    local_1c0 = paVar36;
    do {
      paVar1 = paVar29 + uVar38;
      pvVar31 = local_40;
      if (paVar36 == local_38) {
        pvVar31 = local_48;
      }
      paVar14 = (pvVar31->
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      bVar5 = this->enable_near_clipping;
      bVar6 = (this->rasterizer).enable_far_clipping;
      lVar34 = 0;
      do {
        local_23b[lVar34] = 0;
        lVar35 = (long)*(int *)((long)paVar29->_M_elems + lVar34 * 4 + lVar32) * 0x10;
        fVar3 = *(float *)((long)local_1f8 + lVar35);
        fVar42 = *(float *)((long)local_1f8 + lVar35 + 0xc);
        fVar40 = -fVar42;
        if (fVar3 < fVar40) {
          local_23b[lVar34] = 1;
        }
        if (fVar42 < fVar3) {
          local_23b[lVar34] = local_23b[lVar34] | 2;
        }
        fVar3 = *(float *)((long)local_1f8 + lVar35 + 4);
        if (fVar3 < fVar40) {
          local_23b[lVar34] = local_23b[lVar34] | 4;
        }
        if (fVar42 < fVar3) {
          local_23b[lVar34] = local_23b[lVar34] | 8;
        }
        fVar3 = *(float *)((long)local_1f8 + lVar35 + 8);
        if ((bVar5 != false) && (fVar3 < fVar40)) {
          local_23b[lVar34] = local_23b[lVar34] | 0x10;
        }
        if ((bVar6 != false) && (fVar42 < fVar3)) {
          local_23b[lVar34] = local_23b[lVar34] | 0x20;
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != 3);
      if ((local_23b[1] & local_23b[0] & local_23b[2]) == 0) {
        paVar14 = paVar14 + uVar38;
        if ((local_23b[1] == 0 && local_23b[0] == 0) && local_23b[2] == 0) {
          lVar34 = (long)paVar1->_M_elems[0] * 0x10;
          uVar4 = *(uint *)((long)local_1f8 + lVar34 + 0xc);
          local_108 = ZEXT416(uVar4);
          auVar18._4_4_ = uVar4;
          auVar18._0_4_ = uVar4;
          auVar18._8_4_ = uVar4;
          auVar18._12_4_ = uVar4;
          local_f8 = divps(*(undefined1 (*) [16])((long)local_1f8 + lVar34),auVar18);
          lVar34 = (long)paVar1->_M_elems[1] * 0x10;
          uVar4 = *(uint *)((long)local_1f8 + lVar34 + 0xc);
          local_e8 = ZEXT416(uVar4);
          auVar19._4_4_ = uVar4;
          auVar19._0_4_ = uVar4;
          auVar19._8_4_ = uVar4;
          auVar19._12_4_ = uVar4;
          local_d8 = divps(*(undefined1 (*) [16])((long)local_1f8 + lVar34),auVar19);
          lVar34 = (long)paVar1->_M_elems[2] * 0x10;
          uVar4 = *(uint *)((long)local_1f8 + lVar34 + 0xc);
          local_c8 = ZEXT416(uVar4);
          auVar20._4_4_ = uVar4;
          auVar20._0_4_ = uVar4;
          auVar20._8_4_ = uVar4;
          auVar20._12_4_ = uVar4;
          local_b8 = divps(*(undefined1 (*) [16])((long)local_1f8 + lVar34),auVar20);
          iVar7 = (this->rasterizer).viewport_width;
          iVar8 = (this->rasterizer).viewport_height;
          fVar3 = (float)iVar7 * 0.5;
          fVar42 = (local_f8._0_4_ + 1.0) * fVar3;
          fVar24 = (float)iVar8;
          fVar45 = fVar24 * 0.5;
          fVar22 = fVar24 - (local_f8._4_4_ + 1.0) * fVar45;
          fVar40 = (local_d8._0_4_ + 1.0) * fVar3;
          fVar23 = fVar24 - (local_d8._4_4_ + 1.0) * fVar45;
          fVar3 = (local_b8._0_4_ + 1.0) * fVar3;
          fVar24 = fVar24 - (local_b8._4_4_ + 1.0) * fVar45;
          if ((this->enable_backface_culling != true) ||
             ((fVar24 - fVar22) * (fVar40 - fVar42) - (fVar3 - fVar42) * (fVar23 - fVar22) < 0.0)) {
            local_a8._4_4_ = in_XMM11_Db;
            local_a8._0_4_ = fVar42;
            local_a8._8_4_ = in_XMM11_Dc;
            local_a8._12_4_ = in_XMM11_Dd;
            local_1b8._4_4_ = fVar22;
            local_1b8._0_4_ = fVar42;
            local_238._4_4_ = fVar23;
            local_238._0_4_ = fVar40;
            local_68 = ZEXT416((uint)fVar3);
            local_128 = ZEXT416((uint)fVar24);
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] = fVar24;
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] = fVar3;
            local_98 = ZEXT416((uint)fVar22);
            local_88 = ZEXT416((uint)fVar40);
            local_78 = ZEXT416((uint)fVar23);
            RVar46 = detail::calculate_clipped_bounding_box<float>
                               ((Vector2<float> *)local_1b8,(Vector2<float> *)local_238,
                                (Vector2<float> *)&local_1d8,iVar7,iVar8);
            paVar36 = local_1c0;
            if (0 < RVar46.width && (RVar46.height != 0 && -1 < RVar46._8_8_)) {
              local_1b8._4_4_ = local_98._0_4_;
              local_1b8._0_4_ = local_a8._0_4_;
              local_1b8._8_4_ = (float)local_f8._8_4_;
              local_1b8._12_4_ = 1.0 / (float)local_108._0_4_;
              pMVar37 = (local_220->colors).
                        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pMVar9 = (local_220->colors).
                       super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (pMVar9 == pMVar37) {
                local_1a8 = (pointer)0x0;
                local_1a0 = 0.0;
              }
              else {
                local_1a0 = pMVar37[paVar1->_M_elems[0]].
                            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2];
                local_1a8 = *(pointer *)
                             pMVar37[paVar1->_M_elems[0]].
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array;
              }
              fStack_17c = 1.0 / (float)local_e8._0_4_;
              pMVar12 = (local_220->texcoords).
                        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_19c.m_data.array[1] =
                   *(float *)((long)&pMVar12[paVar14->_M_elems[0]].
                                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                     m_storage.m_data + 4);
              local_19c.m_data.array[0] =
                   pMVar12[paVar14->_M_elems[0]].
                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                   array[0];
              local_188 = (float)local_88._0_4_;
              fStack_184 = (float)local_78._0_4_;
              fStack_180 = (float)local_d8._8_4_;
              if (pMVar9 == pMVar37) {
                local_178[0] = 0.0;
                local_178[1] = 0.0;
                local_178[2] = 0.0;
              }
              else {
                local_178[2] = pMVar37[paVar1->_M_elems[1]].
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array[2];
                local_178._0_8_ =
                     *(undefined8 *)
                      pMVar37[paVar1->_M_elems[1]].
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array;
              }
              fStack_14c = 1.0 / (float)local_c8._0_4_;
              local_16c.m_data.array[1] =
                   *(float *)((long)&pMVar12[paVar14->_M_elems[1]].
                                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                     m_storage.m_data + 4);
              local_16c.m_data.array[0] =
                   pMVar12[paVar14->_M_elems[1]].
                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                   array[0];
              local_158 = (float)local_68._0_4_;
              fStack_154 = (float)local_128._0_4_;
              fStack_150 = (float)local_b8._8_4_;
              if (pMVar9 == pMVar37) {
                local_148[0] = 0.0;
                local_148[1] = 0.0;
                local_148[2] = 0.0;
              }
              else {
                local_148[2] = pMVar37[paVar1->_M_elems[2]].
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array[2];
                local_148._0_8_ =
                     *(undefined8 *)
                      pMVar37[paVar1->_M_elems[2]].
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array;
              }
              local_13c.m_data.array[1] =
                   *(float *)((long)&pMVar12[paVar14->_M_elems[2]].
                                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                     m_storage.m_data + 4);
              local_13c.m_data.array[0] =
                   pMVar12[paVar14->_M_elems[2]].
                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                   array[0];
              std::
              vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
              ::emplace_back<std::array<eos::render::detail::Vertex<float>,3ul>>
                        ((vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                          *)local_218,(array<eos::render::detail::Vertex<float>,_3UL> *)local_1b8);
              paVar36 = local_1c0;
            }
          }
        }
        else {
          local_238 = (undefined1  [8])0x0;
          pVStack_230 = (pointer)0x0;
          local_228 = (pointer)0x0;
          std::
          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
          ::reserve((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                     *)local_238,3);
          pMVar26 = local_220;
          pDVar2 = (DenseStorage<float,_2,_2,_1,_0> *)
                   ((long)local_1f8 + (long)paVar1->_M_elems[0] * 0x10);
          local_1b8._0_8_ = pDVar2->m_data;
          local_1b8._8_8_ = *(undefined8 *)pDVar2[1].m_data.array;
          pMVar37 = (local_220->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((local_220->colors).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pMVar37) {
            local_1a8 = (pointer)0x0;
            local_1a0 = 0.0;
          }
          else {
            local_1a0 = pMVar37[paVar1->_M_elems[0]].
                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                        .array[2];
            local_1a8 = *(pointer *)
                         pMVar37[paVar1->_M_elems[0]].
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
          }
          pMVar12 = (local_220->texcoords).
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_19c.m_data.array[1] =
               *(float *)((long)&pMVar12[paVar14->_M_elems[0]].
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data + 4);
          local_19c.m_data.array[0] =
               pMVar12[paVar14->_M_elems[0]].
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
          ;
          std::
          vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
          ::emplace_back<eos::render::detail::Vertex<float>>
                    ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                      *)local_238,(Vertex<float> *)local_1b8);
          pDVar2 = (DenseStorage<float,_2,_2,_1,_0> *)
                   ((long)local_1f8 + (long)paVar1->_M_elems[1] * 0x10);
          local_1b8._0_8_ = pDVar2->m_data;
          local_1b8._8_8_ = *(undefined8 *)pDVar2[1].m_data.array;
          pMVar37 = (pMVar26->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar26->colors).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pMVar37) {
            local_1a8 = (pointer)0x0;
            local_1a0 = 0.0;
          }
          else {
            local_1a0 = pMVar37[paVar1->_M_elems[1]].
                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                        .array[2];
            local_1a8 = *(pointer *)
                         pMVar37[paVar1->_M_elems[1]].
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
          }
          pMVar12 = (pMVar26->texcoords).
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_19c.m_data.array[1] =
               *(float *)((long)&pMVar12[paVar14->_M_elems[1]].
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data + 4);
          local_19c.m_data.array[0] =
               pMVar12[paVar14->_M_elems[1]].
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
          ;
          std::
          vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
          ::emplace_back<eos::render::detail::Vertex<float>>
                    ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                      *)local_238,(Vertex<float> *)local_1b8);
          local_1b8 = *(undefined1 (*) [16])((long)local_1f8 + (long)paVar1->_M_elems[2] * 0x10);
          pMVar37 = (pMVar26->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar26->colors).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pMVar37) {
            local_1a8 = (pointer)0x0;
            local_1a0 = 0.0;
          }
          else {
            local_1a0 = pMVar37[paVar1->_M_elems[2]].
                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                        .array[2];
            local_1a8 = *(pointer *)
                         pMVar37[paVar1->_M_elems[2]].
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
          }
          pMVar12 = (pMVar26->texcoords).
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_19c.m_data.array[1] =
               *(float *)((long)&pMVar12[paVar14->_M_elems[2]].
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data + 4);
          local_19c.m_data.array[0] =
               pMVar12[paVar14->_M_elems[2]].
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
          ;
          std::
          vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
          ::emplace_back<eos::render::detail::Vertex<float>>
                    ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                      *)local_238,(Vertex<float> *)local_1b8);
          if (this->enable_near_clipping == true) {
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] = 0.0;
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] = 0.0;
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[2] = -1.0;
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[3] = -1.0;
            detail::clip_polygon_to_plane_in_4d
                      ((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                        *)local_1b8,
                       (vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                        *)local_238,&local_1d8);
            pVVar25 = local_228;
            auVar33 = local_238;
            local_238 = (undefined1  [8])local_1b8._0_8_;
            pVStack_230 = (pointer)local_1b8._8_8_;
            local_228 = local_1a8;
            local_1b8 = ZEXT816(0);
            local_1a8 = (pointer)0x0;
            if ((plain_array<float,_2,_0,_0>)auVar33 != (plain_array<float,_2,_0,_0>)0x0) {
              operator_delete((void *)auVar33,(long)pVVar25 - (long)auVar33);
            }
            if ((DenseStorage<float,_2,_2,_1,_0>)local_1b8._0_8_ != (float  [2])0x0) {
              operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
            }
          }
          if ((2 < (ulong)(((long)pVStack_230 - (long)local_238 >> 4) * -0x5555555555555555)) &&
             ((long)pVStack_230 - (long)local_238 != 0x60)) {
            bVar39 = 0;
            do {
              fVar3 = *(float *)((long)local_238 + 0xc);
              local_c8 = ZEXT416((uint)fVar3);
              auVar15._4_4_ = fVar3;
              auVar15._0_4_ = fVar3;
              auVar15._8_4_ = fVar3;
              auVar15._12_4_ = fVar3;
              local_b8 = divps(*(undefined1 (*) [16])local_238,auVar15);
              uVar30 = (ulong)((bVar39 + 1) * 0x30);
              uVar4 = *(uint *)((long)((long)local_238 + 0xc) + uVar30);
              local_f8 = ZEXT416(uVar4);
              auVar16._4_4_ = uVar4;
              auVar16._0_4_ = uVar4;
              auVar16._8_4_ = uVar4;
              auVar16._12_4_ = uVar4;
              local_d8 = divps(*(undefined1 (*) [16])((long)local_238 + uVar30),auVar16);
              uVar30 = (ulong)((bVar39 + 2) * 0x30);
              uVar4 = *(uint *)((long)((long)local_238 + 0xc) + uVar30);
              local_108 = ZEXT416(uVar4);
              auVar17._4_4_ = uVar4;
              auVar17._0_4_ = uVar4;
              auVar17._8_4_ = uVar4;
              auVar17._12_4_ = uVar4;
              local_e8 = divps(*(undefined1 (*) [16])((long)local_238 + uVar30),auVar17);
              iVar7 = (this->rasterizer).viewport_width;
              iVar8 = (this->rasterizer).viewport_height;
              dVar41 = (double)iVar7 * 0.5;
              fVar22 = (float)iVar8;
              fVar42 = fVar22 * 0.5;
              fVar3 = fVar22 - (local_b8._4_4_ + 1.0) * fVar42;
              auVar43._8_8_ = local_d8._8_8_;
              auVar43._0_8_ = (double)(local_d8._0_4_ + 1.0) * dVar41;
              fVar40 = fVar22 - (local_d8._4_4_ + 1.0) * fVar42;
              dVar21 = (double)(local_e8._0_4_ + 1.0) * dVar41;
              fVar22 = fVar22 - (local_e8._4_4_ + 1.0) * fVar42;
              fVar45 = (float)((double)(local_b8._0_4_ + 1.0) * dVar41);
              auVar44._4_12_ = auVar43._4_12_;
              auVar44._0_4_ = (float)auVar43._0_8_;
              fVar42 = (float)dVar21;
              if ((this->enable_backface_culling != true) ||
                 ((fVar22 - fVar3) * (auVar44._0_4_ - fVar45) - (fVar42 - fVar45) * (fVar40 - fVar3)
                  < 0.0)) {
                local_78 = ZEXT416((uint)fVar3);
                local_1b8._4_4_ = fVar3;
                local_1b8._0_4_ = fVar45;
                local_68 = ZEXT416((uint)fVar40);
                local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[1] = fVar40;
                local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[0] = auVar44._0_4_;
                local_88._4_4_ = (int)((ulong)dVar21 >> 0x20);
                local_88._0_4_ = fVar42;
                local_88._8_4_ = local_e8._8_4_;
                local_88._12_4_ = local_e8._12_4_;
                local_128 = ZEXT416((uint)fVar22);
                local_110.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                m_data.array[0] = fVar42;
                local_110.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                m_data.array[1] = fVar22;
                local_a8 = ZEXT416((uint)fVar45);
                local_98 = auVar44;
                RVar46 = detail::calculate_clipped_bounding_box<float>
                                   ((Vector2<float> *)local_1b8,(Vector2<float> *)&local_1d8,
                                    &local_110,iVar7,iVar8);
                if (0 < RVar46.width && (RVar46.height != 0 && -1 < RVar46._8_8_)) {
                  fStack_17c = 1.0 / (float)local_f8._0_4_;
                  fStack_14c = 1.0 / (float)local_108._0_4_;
                  local_1b8._4_4_ = local_78._0_4_;
                  local_1b8._0_4_ = local_a8._0_4_;
                  local_1b8._8_4_ = (float)local_b8._8_4_;
                  local_1b8._12_4_ = 1.0 / (float)local_c8._0_4_;
                  local_1a0 = *(float *)((long)local_238 + 0x18);
                  local_1a8 = *(pointer *)
                               (((Vector3<float> *)((long)local_238 + 0x10))->
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array;
                  local_19c.m_data.array =
                       *(plain_array<float,_2,_0,_0> *)
                        (((Vector2<float> *)((long)local_238 + 0x1c))->
                        super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.
                        m_data.array;
                  local_188 = (float)local_98._0_4_;
                  fStack_184 = (float)local_68._0_4_;
                  fStack_180 = (float)local_d8._8_4_;
                  uVar30 = (ulong)((bVar39 + 1) * 0x30);
                  local_178[2] = *(float *)((long)((long)local_238 + 0x18) + uVar30);
                  local_178._0_8_ =
                       *(undefined8 *)
                        ((long)(((Vector3<float> *)((long)local_238 + 0x10))->
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array + uVar30);
                  local_16c.m_data.array =
                       ((DenseStorage<float,_2,_2,_1,_0> *)
                       ((long)(((Vector2<float> *)((long)local_238 + 0x1c))->
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage
                              .m_data.array + uVar30))->m_data;
                  local_158 = (float)local_88._0_4_;
                  fStack_154 = (float)local_128._0_4_;
                  fStack_150 = (float)local_e8._8_4_;
                  uVar30 = (ulong)((bVar39 + 2) * 0x30);
                  local_148[2] = *(float *)((long)((long)local_238 + 0x18) + uVar30);
                  local_148._0_8_ =
                       *(undefined8 *)
                        ((long)(((Vector3<float> *)((long)local_238 + 0x10))->
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array + uVar30);
                  local_13c.m_data.array =
                       ((DenseStorage<float,_2,_2,_1,_0> *)
                       ((long)(((Vector2<float> *)((long)local_238 + 0x1c))->
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage
                              .m_data.array + uVar30))->m_data;
                  std::
                  vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                  ::emplace_back<std::array<eos::render::detail::Vertex<float>,3ul>>
                            ((vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                              *)local_218,
                             (array<eos::render::detail::Vertex<float>,_3UL> *)local_1b8);
                }
              }
              bVar39 = bVar39 + 1;
            } while ((ulong)bVar39 <
                     ((long)pVStack_230 - (long)local_238 >> 4) * -0x5555555555555555 - 2U);
          }
          texture_00 = local_118;
          paVar36 = local_1c0;
          if ((float  [2])local_238 != (float  [2])0x0) {
            operator_delete((void *)local_238,(long)local_228 - (long)local_238);
            texture_00 = local_118;
            paVar36 = local_1c0;
          }
        }
      }
      uVar38 = uVar38 + 1;
      paVar29 = (local_220->tvi).
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar32 = lVar32 + 0xc;
    } while (uVar38 < (ulong)(((long)(local_220->tvi).
                                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar29 >> 2
                              ) * -0x5555555555555555));
  }
  pVVar27 = uStack_210;
  if (local_218 != (undefined1  [8])uStack_210) {
    auVar33 = local_218;
    do {
      Rasterizer<eos::render::TexturingFragmentShader>::raster_triangle<float>
                (&this->rasterizer,(Vertex<float> *)auVar33,(Vertex<float> *)((long)auVar33 + 0x30),
                 (Vertex<float> *)((long)auVar33 + 0x60),texture_00);
      auVar33 = (undefined1  [8])((long)auVar33 + 0x90);
    } while (auVar33 != (undefined1  [8])pVVar27);
  }
  pIVar28 = local_50;
  local_50->row_stride = (this->rasterizer).colorbuffer.row_stride;
  iVar7 = (this->rasterizer).colorbuffer.width_;
  local_50->height_ = (this->rasterizer).colorbuffer.height_;
  local_50->width_ = iVar7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_50->data_,&(this->rasterizer).colorbuffer.data_);
  if (local_218 != (undefined1  [8])0x0) {
    operator_delete((void *)local_218,local_208 - (long)local_218);
  }
  if (local_1f8 != (void *)0x0) {
    operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  return pIVar28;
}

Assistant:

core::Image4u render(const core::Mesh& mesh, const Eigen::Matrix4<T>& model_view_matrix,
                         const Eigen::Matrix4<T>& projection_matrix,
                         const cpp17::optional<Texture>& texture = cpp17::nullopt)
    {
        // The number of vertices has to be equal for both shape and colour, or, alternatively, it has to be a
        // shape-only model:
        assert(mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty());
        // Make sure one of these three things is true:
        //  a) There are texture coordinates given for each vertex (the texture map doesn't contain any seams)
        //  b) A different number of tex coords and vertices (i.e. the texture map contains seams): A separate
        //     list of texture triangle indices has to be given (i.e. mesh.tti is not empty)
        //  c) There are no texture coordinates given (i.e. rendering without texture).
        assert(mesh.vertices.size() == mesh.texcoords.size() ||
               ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) ||
               mesh.texcoords.empty());
        // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
        assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());
        // Make sure either no texture is given, or a texture and texture coords:
        // (Potential todo: Is there a texturing flag we should check for too?)
        assert(!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0));

        using detail::divide_by_w;
        using std::vector;

        vector<Eigen::Vector4<T>> clipspace_vertices;
        for (const auto& vertex_position : mesh.vertices)
        {
            // Note: We make an unnecessary copy of the vertex_position here. We could perhaps improve this by
            // using vertex_shader.operator()<vertex_type, T>(...). We're also making vertex_position the same
            // type as the matrix here, which we wouldn't necessarily need to, as VertexShader supports a
            // VertexType and MatrixType.
            clipspace_vertices.push_back(
                vertex_shader(Eigen::Vector4<T>(vertex_position.homogeneous()), model_view_matrix, projection_matrix));
            // Note: if mesh.colors.empty() (in case of shape-only model!), then the vertex colour is no
            // longer set to gray. But we don't want that here, maybe we only want texturing, then we don't
            // need vertex-colours at all. We can do it in a custom VertexShader if needed.
        }

        // All vertices are in clip-space now. Prepare the rasterisation stage:
        vector<Triangle<T>> triangles_to_raster;
        const auto& tti = mesh.tti.empty() ? mesh.tvi : mesh.tti; // If tti is not empty, we'll use it, otherwise,
                                                                  // use tvi for texturing.

        // In the loop further below, we're building a list of triangles to render, and will be indexing into
        // Mesh::colors. But that array is not available for meshes without per-vertex colouring. So we'll use
        // the below lambda which either returns the colours for the vertex, or an empty vector.
        const auto get_color_or_zero = [](const std::vector<Eigen::Vector3f>& mesh_colors, int vertex_index) {
            if (mesh_colors.size() > 0)
            {
                return mesh_colors[vertex_index];
            } else
            {
                return Eigen::Vector3f(0.0f, 0.0f, 0.0f);
            }
        };

        // This builds the (one and final) triangles to render. Meaning: The triangles formed of mesh.tvi (the
        // ones that survived the clip/culling), plus possibly more that intersect one of the frustum planes
        // (i.e. this can generate new triangles with new pos/vc/texcoords).
        for (std::size_t tri_index = 0; tri_index < mesh.tvi.size(); ++tri_index)
        {
            const auto& tri_indices = mesh.tvi[tri_index];
            const auto& tri_tc_indices = tti[tri_index];
            unsigned char visibility_bits[3];
            for (unsigned char k = 0; k < 3; k++)
            {
                visibility_bits[k] = 0;
                const auto x_cc = clipspace_vertices[tri_indices[k]].x();
                const auto y_cc = clipspace_vertices[tri_indices[k]].y();
                const auto z_cc = clipspace_vertices[tri_indices[k]].z();
                const auto w_cc = clipspace_vertices[tri_indices[k]].w();
                if (x_cc < -w_cc) // true if outside of view frustum. False if on or inside the plane.
                    visibility_bits[k] |= 1; // set bit if outside of frustum
                if (x_cc > w_cc)
                    visibility_bits[k] |= 2;
                if (y_cc < -w_cc)
                    visibility_bits[k] |= 4;
                if (y_cc > w_cc)
                    visibility_bits[k] |= 8;
                if (enable_near_clipping && z_cc < -w_cc) // near plane frustum clipping
                    visibility_bits[k] |= 16;
                if (rasterizer.enable_far_clipping && z_cc > w_cc) // far plane frustum clipping
                    visibility_bits[k] |= 32;
            } // if all bits are 0, then it's inside the frustum
            // all vertices are not visible - reject the triangle.
            if ((visibility_bits[0] & visibility_bits[1] & visibility_bits[2]) > 0)
            {
                continue;
            }
            // all vertices are visible - pass the whole triangle to the rasteriser. = All bits of all 3
            // triangles are 0.
            if ((visibility_bits[0] | visibility_bits[1] | visibility_bits[2]) == 0)
            {
                // relevant part of process_prospective_tri:
                std::array<Eigen::Vector4<T>, 3> prospective_tri{
                    divide_by_w(clipspace_vertices[tri_indices[0]]),
                    divide_by_w(clipspace_vertices[tri_indices[1]]),
                    divide_by_w(clipspace_vertices[tri_indices[2]])};
                // We have a prospective tri in NDC coords now, with its vertices having coords [x_ndc, y_ndc,
                // z_ndc, 1/w_clip].

                // Replaces x and y of the NDC coords with the screen coords. Keep z and w the same.
                const Eigen::Vector2<T> v0_screen =
                    clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[0].x() = v0_screen.x();
                prospective_tri[0].y() = v0_screen.y();
                const Eigen::Vector2<T> v1_screen =
                    clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[1].x() = v1_screen.x();
                prospective_tri[1].y() = v1_screen.y();
                const Eigen::Vector2<T> v2_screen =
                    clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[2].x() = v2_screen.x();
                prospective_tri[2].y() = v2_screen.y();

                // Culling (front/back/none - or what are OpenGL's modes?). Do we do any culling
                // elsewhere? No?
                if (enable_backface_culling)
                {
                    // Note/Todo: Isn't this just v0_screen, etc.? Let's assume for now it is. So before, we had here:
                    // prospective_tri[0], [1], [2], but we only need their x and y coords.
                    if (!detail::are_vertices_ccw_in_screen_space(
                            Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                            Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                            Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                        continue;
                }

                // Get the bounding box of the triangle:
                const auto boundingBox = detail::calculate_clipped_bounding_box(
                    Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                    Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                    Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                    rasterizer.viewport_width, rasterizer.viewport_height);
                const auto min_x = boundingBox.x;
                const auto max_x = boundingBox.x + boundingBox.width;
                const auto min_y = boundingBox.y;
                const auto max_y = boundingBox.y + boundingBox.height;
                if (max_x <= min_x || max_y <= min_y)
                { // Note: Can the width/height of the bbox be negative? Maybe we only need to check for
                    // equality here?
                    continue;
                }

                // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                triangles_to_raster.push_back(Triangle<T>{
                    detail::Vertex<T>{prospective_tri[0], get_color_or_zero(mesh.colors, tri_indices[0]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                          mesh.texcoords[tri_tc_indices[0]](1))},
                    detail::Vertex<T>{prospective_tri[1], get_color_or_zero(mesh.colors, tri_indices[1]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                          mesh.texcoords[tri_tc_indices[1]](1))},
                    detail::Vertex<T>{prospective_tri[2], get_color_or_zero(mesh.colors, tri_indices[2]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                          mesh.texcoords[tri_tc_indices[2]](1))}});
                continue; // Triangle was either added or not added. Continue with next triangle.
            }
            // At this point, the triangle is known to be intersecting one of the view frustum's planes
            // Note: It seems that this is only w.r.t. the near-plane. If a triangle is partially outside the
            // tlbr viewport, it'll get rejected.
            // Well, 'z' of these triangles seems to be -1, so is that really the near plane?
            std::vector<detail::Vertex<T>> vertices;
            vertices.reserve(3);
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[0]],
                                                    get_color_or_zero(mesh.colors, tri_indices[0]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                                     mesh.texcoords[tri_tc_indices[0]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[1]],
                                                    get_color_or_zero(mesh.colors, tri_indices[1]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                                     mesh.texcoords[tri_tc_indices[1]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[2]],
                                                    get_color_or_zero(mesh.colors, tri_indices[2]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                                     mesh.texcoords[tri_tc_indices[2]](1))});
            // split the triangle if it intersects the near plane:
            if (enable_near_clipping)
            {
                vertices = clip_polygon_to_plane_in_4d(
                    vertices, Eigen::Vector4<T>(T(0.0), T(0.0), T(-1.0),
                                               T(-1.0))); // "Normal" (or "4D hyperplane") of the near-plane.
                                                          // I tested it and it works like this but I'm a
                                                          // little bit unsure because Songho says the normal
                                                          // of the near-plane is (0,0,-1,1) (maybe I have to
                                                          // switch around the < 0 checks in the function?)
            }

            // Triangulation of the polygon formed of the 'vertices' array:
            if (vertices.size() >= 3)
            {
                for (unsigned char k = 0; k < vertices.size() - 2; k++)
                {
                    // Build a triangle from vertices[0], vertices[1 + k], vertices[2 + k]:
                    // Add to triangles_to_raster if it passed culling etc.
                    // TODO: This does the same as above - the code is copied 1:1. Avoid!
                    // COPY START (but init of prospective_tri is changed, as well as init of 't'.)
                    std::array<Eigen::Vector4<T>, 3> prospective_tri{divide_by_w(vertices[0].position),
                                                                    divide_by_w(vertices[1 + k].position),
                                                                    divide_by_w(vertices[2 + k].position)};

                    const Eigen::Vector2<T> v0_screen =
                        clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[0].x() = v0_screen.x();
                    prospective_tri[0].y() = v0_screen.y();
                    const Eigen::Vector2<T> v1_screen =
                        clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[1].x() = v1_screen.x();
                    prospective_tri[1].y() = v1_screen.y();
                    const Eigen::Vector2<T> v2_screen =
                        clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[2].x() = v2_screen.x();
                    prospective_tri[2].y() = v2_screen.y();

                    if (enable_backface_culling)
                    {
                        if (!detail::are_vertices_ccw_in_screen_space(
                                Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                                Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                                Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                            continue;
                    }

                    const auto boundingBox = detail::calculate_clipped_bounding_box(
                        Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                        Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                        Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                        rasterizer.viewport_width, rasterizer.viewport_height);
                    const auto min_x = boundingBox.x;
                    const auto max_x = boundingBox.x + boundingBox.width;
                    const auto min_y = boundingBox.y;
                    const auto max_y = boundingBox.y + boundingBox.height;
                    if (max_x <= min_x || max_y <= min_y)
                    {
                        continue;
                    }

                    // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                    triangles_to_raster.push_back(Triangle<T>{
                        detail::Vertex<T>{prospective_tri[0], vertices[0].color, vertices[0].texcoords},
                        detail::Vertex<T>{prospective_tri[1], vertices[1 + k].color,
                                             vertices[1 + k].texcoords},
                        detail::Vertex<T>{prospective_tri[2], vertices[2 + k].color,
                                             vertices[2 + k].texcoords}});
                    // continue; // triangle was either added or not added. Continue with next triangle.
                    // COPY END
                }
            }

        } // end of loop over all triangles

        // Each triangle contains [x_screen, y_screen, z_ndc, 1/w_clip].
        // We may have more triangles than in the original mesh.

        // Raster each triangle and apply the fragment shader on each pixel:
        for (const auto& tri : triangles_to_raster)
        {
            rasterizer.raster_triangle(tri[0], tri[1], tri[2], texture);
        }
        return rasterizer.colorbuffer;
    }